

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

bool __thiscall
wasm::EquivalentClass::deriveParams
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          bool isCallIndirectionEnabled)

{
  initializer_list<wasm::Expression_**> __l;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference ppFVar4;
  Expression **ppEVar5;
  Const *pCVar6;
  reference pDVar7;
  Expression **ppEVar8;
  Const *pCVar9;
  Call *pCVar10;
  Call *pCVar11;
  allocator<wasm::Expression_**> local_311;
  Expression **local_310;
  iterator local_308;
  size_type local_300;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_2f8;
  variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_2e0;
  ParamInfo local_2a0;
  Expression **local_248;
  reference local_240;
  ParamInfo *param;
  iterator __end2;
  iterator __begin2;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *__range2;
  bool paramReused;
  DeepValueIterator *it_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *__range4_1;
  Call *siblingCall;
  Expression **sibling_1;
  DeepValueIterator *it_1;
  iterator __end4;
  iterator __begin4;
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *__range4;
  Call *primaryCall;
  Const *siblingConst;
  Expression **sibling;
  DeepValueIterator *it;
  iterator __end3;
  iterator __begin3;
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *__range3;
  Const *primaryConst;
  undefined1 local_180 [7];
  bool isAllSame;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  Literals values;
  ConstDiff diff;
  Expression **primary;
  Expression **local_d8;
  __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  local_d0;
  __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  local_c8;
  __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  local_c0;
  __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  func;
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> siblingIterators;
  DeepValueIterator primaryIt;
  bool isCallIndirectionEnabled_local;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params_local;
  Module *module_local;
  EquivalentClass *this_local;
  
  bVar1 = Importable::imported(&this->primaryFunction->super_Importable);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::
    DeepValueIterator::DeepValueIterator(wasm::Expression___
              (&siblingIterators.
                super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&this->primaryFunction->body);
    std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::vector
              ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
    sVar3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size(&this->functions)
    ;
    if (sVar3 < 2) {
      __assert_fail("functions.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                    ,0x178,
                    "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                   );
    }
    local_c8._M_current =
         (Function **)
         std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin(&this->functions);
    local_c0 = __gnu_cxx::
               __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
               ::operator+(&local_c8,1);
    while( true ) {
      local_d0._M_current =
           (Function **)
           std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(&this->functions);
      bVar1 = __gnu_cxx::operator!=(&local_c0,&local_d0);
      if (!bVar1) break;
      ppFVar4 = __gnu_cxx::
                __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                ::operator*(&local_c0);
      local_d8 = &(*ppFVar4)->body;
      std::
      vector<wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::DeepValueIterator,std::allocator<wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::DeepValueIterator>>
      ::emplace_back<wasm::Expression**>
                ((vector<wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::DeepValueIterator,std::allocator<wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::DeepValueIterator>>
                  *)&func,&local_d8);
      __gnu_cxx::
      __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::operator++(&local_c0);
    }
    while (bVar1 = deriveParams::DeepValueIterator::empty
                             ((DeepValueIterator *)
                              &siblingIterators.
                               super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      ppEVar5 = deriveParams::DeepValueIterator::operator*
                          ((DeepValueIterator *)
                           &siblingIterators.
                            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::variant
                ((variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                 &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      Literals::Literals((Literals *)
                         &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_180);
      primaryConst._7_1_ = 1;
      pCVar6 = Expression::dynCast<wasm::Const>(*ppEVar5);
      if (pCVar6 == (Const *)0x0) {
        if ((isCallIndirectionEnabled) && (bVar1 = Expression::is<wasm::Call>(*ppEVar5), bVar1)) {
          pCVar10 = Expression::dynCast<wasm::Call>(*ppEVar5);
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_180,&pCVar10->target);
          __end4 = std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::begin
                             ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func
                             );
          it_1 = (DeepValueIterator *)
                 std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::end
                           ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                                             *)&it_1), bVar1) {
            pDVar7 = __gnu_cxx::
                     __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                     ::operator*(&__end4);
            ppEVar8 = deriveParams::DeepValueIterator::operator*(pDVar7);
            deriveParams::DeepValueIterator::operator++(pDVar7);
            pCVar11 = Expression::dynCast<wasm::Call>(*ppEVar8);
            if (pCVar11 == (Call *)0x0) {
              handle_unreachable("all sibling functions should have the same instruction type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                 ,0x19d);
            }
            bVar1 = IString::operator==(&(pCVar10->target).super_IString,
                                        &(pCVar11->target).super_IString);
            primaryConst._7_1_ = bVar1 & primaryConst._7_1_;
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_180,&pCVar11->target
                      );
            __gnu_cxx::
            __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
            ::operator++(&__end4);
          }
          std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                    ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                     &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_180);
          goto LAB_0184ac84;
        }
        __end4_1 = std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::begin
                             ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func
                             );
        it_2 = (DeepValueIterator *)
               std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::end
                         ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                                   *)&it_2), bVar1) {
          pDVar7 = __gnu_cxx::
                   __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                   ::operator*(&__end4_1);
          ppEVar8 = deriveParams::DeepValueIterator::operator*(pDVar7);
          if ((*ppEVar8)->_id != (*ppEVar5)->_id) {
            __assert_fail("(*it)->_id == primary->_id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                          ,0x1a6,
                          "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                         );
          }
          deriveParams::DeepValueIterator::operator++(pDVar7);
          __gnu_cxx::
          __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
          ::operator++(&__end4_1);
        }
      }
      else {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&pCVar6->value);
        __end3 = std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::begin
                           ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
        it = (DeepValueIterator *)
             std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::end
                       ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                                           *)&it), bVar1) {
          pDVar7 = __gnu_cxx::
                   __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
                   ::operator*(&__end3);
          ppEVar8 = deriveParams::DeepValueIterator::operator*(pDVar7);
          deriveParams::DeepValueIterator::operator++(pDVar7);
          pCVar9 = Expression::dynCast<wasm::Const>(*ppEVar8);
          if (pCVar9 == (Const *)0x0) {
            handle_unreachable("all sibling functions should have the same instruction type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                               ,0x18e);
          }
          bVar1 = wasm::Literal::operator==(&pCVar6->value,&pCVar9->value);
          primaryConst._7_1_ = bVar1 & primaryConst._7_1_;
          SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)
                     &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&pCVar9->value);
          __gnu_cxx::
          __normal_iterator<DeepValueIterator_*,_std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>_>
          ::operator++(&__end3);
        }
        std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                  ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                   &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (Literals *)
                   &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
LAB_0184ac84:
        if (primaryConst._7_1_ == 0) {
          bVar1 = false;
          __end2 = std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::begin(params);
          param = (ParamInfo *)
                  std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::end(params);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
                                             *)&param), bVar2) {
            local_240 = __gnu_cxx::
                        __normal_iterator<wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
                        ::operator*(&__end2);
            bVar2 = std::operator==(&local_240->values,
                                    (variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                     *)&values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar2) {
              local_248 = ppEVar5;
              std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                        (&local_240->uses,&local_248);
              bVar1 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<wasm::ParamInfo_*,_std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>_>
            ::operator++(&__end2);
          }
          if (!bVar1) {
            std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
            variant(&local_2e0,
                    (variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                     *)&values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            local_308 = &local_310;
            local_300 = 1;
            local_310 = ppEVar5;
            std::allocator<wasm::Expression_**>::allocator(&local_311);
            __l._M_len = local_300;
            __l._M_array = local_308;
            std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
                      (&local_2f8,__l,&local_311);
            ParamInfo::ParamInfo(&local_2a0,&local_2e0,&local_2f8);
            std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::push_back
                      (params,&local_2a0);
            ParamInfo::~ParamInfo(&local_2a0);
            std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~vector
                      (&local_2f8);
            std::allocator<wasm::Expression_**>::~allocator(&local_311);
            std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
            ~variant(&local_2e0);
          }
        }
      }
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_180);
      Literals::~Literals((Literals *)
                          &names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~variant
                ((variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                 &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      deriveParams::DeepValueIterator::operator++
                ((DeepValueIterator *)
                 &siblingIterators.
                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = true;
    std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::~vector
              ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)&func);
    deriveParams::DeepValueIterator::~DeepValueIterator
              ((DeepValueIterator *)
               &siblingIterators.
                super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return this_local._7_1_;
}

Assistant:

bool EquivalentClass::deriveParams(Module* module,
                                   std::vector<ParamInfo>& params,
                                   bool isCallIndirectionEnabled) {
  // Allows iteration over children of the root expression recursively.
  struct DeepValueIterator {
    // The DFS work list.
    SmallVector<Expression**, 10> tasks;

    DeepValueIterator(Expression** root) { tasks.push_back(root); }

    void operator++() {
      ChildIterator it(*tasks.back());
      tasks.pop_back();
      for (Expression*& child : it) {
        tasks.push_back(&child);
      }
    }

    Expression*& operator*() {
      assert(!empty());
      return *tasks.back();
    }
    bool empty() { return tasks.empty(); }
  };

  if (primaryFunction->imported()) {
    return false;
  }
  DeepValueIterator primaryIt(&primaryFunction->body);
  std::vector<DeepValueIterator> siblingIterators;
  // Skip the first function, as it is the primary function to compare the
  // primary function with the other functions based on the primary instr type.
  assert(functions.size() >= 2);
  for (auto func = functions.begin() + 1; func != functions.end(); ++func) {
    siblingIterators.emplace_back(&(*func)->body);
  }

  for (; !primaryIt.empty(); ++primaryIt) {
    Expression*& primary = *primaryIt;
    ConstDiff diff;
    Literals values;
    std::vector<Name> names;

    bool isAllSame = true;
    if (auto* primaryConst = primary->dynCast<Const>()) {
      values.push_back(primaryConst->value);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingConst = sibling->dynCast<Const>()) {
          isAllSame &= primaryConst->value == siblingConst->value;
          values.push_back(siblingConst->value);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = values;
    } else if (isCallIndirectionEnabled && primary->is<Call>()) {
      auto* primaryCall = primary->dynCast<Call>();
      names.push_back(primaryCall->target);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingCall = sibling->dynCast<Call>()) {
          isAllSame &= primaryCall->target == siblingCall->target;
          names.push_back(siblingCall->target);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = names;
    } else {
      // Skip non-constant expressions, which are ensured to be the exactly
      // same.
      for (auto& it : siblingIterators) {
        // Sibling functions in a class should have the same instruction type.
        assert((*it)->_id == primary->_id);
        ++it;
      }
      continue;
    }
    // If all values are the same, skip to parameterize it.
    if (isAllSame) {
      continue;
    }
    // If the derived param is already in the params, reuse it.
    // e.g.
    //
    // ```
    // (func $use-42-twice (result i32)
    //   (i32.add (i32.const 42) (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //   (i32.add (i32.const 43) (i32.const 43))
    // )
    // ```
    //
    // will be merged reusing the parameter [42, 43]
    //
    // ```
    // (func $use-42-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 43))
    // )
    // (func $byn$mgfn-shared$use-42-twice (param $0 i32) (result i32)
    //  (i32.add (local.get $0) (local.get $0))
    // )
    // ```
    //
    bool paramReused = false;
    for (auto& param : params) {
      if (param.values == diff) {
        param.uses.push_back(&primary);
        paramReused = true;
        break;
      }
    }
    if (!paramReused) {
      params.push_back(ParamInfo(diff, {&primary}));
    }
  }
  return true;
}